

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O3

void __thiscall CTcPrsGramNodeOr::init_expansion(CTcPrsGramNodeOr *this)

{
  CTcPrsGramNode *pCVar1;
  
  pCVar1 = (this->super_CTcPrsGramNodeWithChildren).sub_head_;
  this->cur_alt_ = pCVar1;
  (*(pCVar1->super_CTcTokenSource)._vptr_CTcTokenSource[8])();
  this->field_0x80 = this->field_0x80 & 0xfc | 2;
  return;
}

Assistant:

virtual void init_expansion()
    {
        /* start at the first alternative */
        cur_alt_ = sub_head_;

        /* initialize the first alternative for expansion */
        cur_alt_->init_expansion();

        /* we didn't just do an 'or' */
        just_did_or_ = FALSE;

        /* we haven't yet returned the first token */
        before_first_ = TRUE;
    }